

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QCommonListViewBase::updateHorizontalScrollBar(QCommonListViewBase *this,QSize *step)

{
  int iVar1;
  QWidgetData *pQVar2;
  ScrollBarPolicy SVar3;
  QScrollBar *pQVar4;
  QSize QVar5;
  Representation RVar6;
  int max;
  bool bVar7;
  
  pQVar4 = horizontalScrollBar(this);
  QAbstractSliderPrivate::itemviewChangeSingleStep
            (*(QAbstractSliderPrivate **)&(pQVar4->super_QAbstractSlider).super_QWidget.field_0x8,
             this->dd->space + (step->wd).m_i);
  pQVar4 = horizontalScrollBar(this);
  pQVar2 = ((this->dd->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  QAbstractSlider::setPageStep
            (&pQVar4->super_QAbstractSlider,((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1);
  SVar3 = QAbstractScrollArea::verticalScrollBarPolicy((QAbstractScrollArea *)this->qq);
  bVar7 = true;
  if (SVar3 == ScrollBarAsNeeded) {
    SVar3 = QAbstractScrollArea::horizontalScrollBarPolicy((QAbstractScrollArea *)this->qq);
    bVar7 = SVar3 != ScrollBarAsNeeded;
  }
  QVar5 = QListModeViewBase::viewportSize(&this->qq->super_QAbstractItemView);
  RVar6 = QVar5.wd.m_i;
  iVar1 = (this->contentsSize).wd.m_i;
  if (QVar5.ht.m_i.m_i < (this->contentsSize).ht.m_i) {
    pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->qq);
    pQVar2 = (pQVar4->super_QAbstractSlider).super_QWidget.data;
    RVar6.m_i = ~(pQVar2->crect).x2.m_i + RVar6.m_i + (pQVar2->crect).x1.m_i;
  }
  pQVar4 = horizontalScrollBar(this);
  max = 0;
  if ((bool)(bVar7 | RVar6.m_i < iVar1)) {
    pQVar2 = ((this->dd->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
             ->data;
    max = ~(pQVar2->crect).x2.m_i + (this->contentsSize).wd.m_i + (pQVar2->crect).x1.m_i;
  }
  QAbstractSlider::setRange(&pQVar4->super_QAbstractSlider,0,max);
  return;
}

Assistant:

void QCommonListViewBase::updateHorizontalScrollBar(const QSize &step)
{
    horizontalScrollBar()->d_func()->itemviewChangeSingleStep(step.width() + spacing());
    horizontalScrollBar()->setPageStep(viewport()->width());

    // If both scroll bars are set to auto, we might end up in a situation with enough space
    // for the actual content. But still one of the scroll bars will become enabled due to
    // the other one using the space. The other one will become invisible in the same cycle.
    // -> Infinite loop, QTBUG-39902
    const bool bothScrollBarsAuto = qq->verticalScrollBarPolicy() == Qt::ScrollBarAsNeeded &&
                                    qq->horizontalScrollBarPolicy() == Qt::ScrollBarAsNeeded;

    const QSize viewportSize = QListModeViewBase::viewportSize(qq);

    bool verticalWantsToShow = contentsSize.height() > viewportSize.height();
    bool horizontalWantsToShow;
    if (verticalWantsToShow)
        horizontalWantsToShow = contentsSize.width() > viewportSize.width() - qq->verticalScrollBar()->width();
    else
        horizontalWantsToShow = contentsSize.width() > viewportSize.width();

    if (bothScrollBarsAuto && !horizontalWantsToShow) {
        // break the infinite loop described above by setting the range to 0, 0.
        // QAbstractScrollArea will then hide the scroll bar for us
        horizontalScrollBar()->setRange(0, 0);
    } else {
        horizontalScrollBar()->setRange(0, contentsSize.width() - viewport()->width());
    }
}